

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O1

void __thiscall
chrono::ChGlyphs::SetGlyphCoordsys(ChGlyphs *this,uint id,ChCoordsys<double> *mcoord)

{
  ChCoordsys<double> *pCVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pCVar4;
  
  uVar2 = ((long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar3 = (ulong)id;
  if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
  }
  pCVar1 = (ChCoordsys<double> *)
           ((this->points).
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar3);
  if (pCVar1 != mcoord) {
    (pCVar1->pos).m_data[0] = (mcoord->pos).m_data[0];
    (pCVar1->pos).m_data[1] = (mcoord->pos).m_data[1];
    (pCVar1->pos).m_data[2] = (mcoord->pos).m_data[2];
  }
  if ((ulong)((long)(this->rotations).
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->rotations).
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) {
    std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
    resize(&this->rotations,(ulong)(id + 1));
  }
  pCVar4 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar3;
  if (&mcoord->rot != pCVar4) {
    pCVar4->m_data[0] = (mcoord->rot).m_data[0];
    pCVar4->m_data[1] = (mcoord->rot).m_data[1];
    pCVar4->m_data[2] = (mcoord->rot).m_data[2];
    pCVar4->m_data[3] = (mcoord->rot).m_data[3];
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphCoordsys(unsigned int id, ChCoordsys<> mcoord) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mcoord.pos;

    if (rotations.size() <= id)
        rotations.resize(id + 1);
    rotations[id] = mcoord.rot;
}